

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

CURLcode Curl_conncache_add_conn(conncache *connc,connectdata *conn)

{
  Curl_easy *data;
  conncache *h;
  size_t sVar1;
  long lVar2;
  connectbundle *cb_ptr;
  size_t key_len;
  void *pvVar3;
  size_t len;
  CURLcode CVar4;
  char key [128];
  
  data = conn->data;
  cb_ptr = Curl_conncache_find_bundle(conn,(data->state).conn_cache);
  if (cb_ptr == (connectbundle *)0x0) {
    cb_ptr = (connectbundle *)(*Curl_cmalloc)(0x30);
    if (cb_ptr != (connectbundle *)0x0) {
      cb_ptr->num_connections = 0;
      cb_ptr->multiuse = 0;
      Curl_llist_init(&cb_ptr->conn_list,conn_llist_dtor);
      hashkey(conn,key,len);
      h = (data->state).conn_cache;
      key_len = strlen(key);
      pvVar3 = Curl_hash_add(&h->hash,key,key_len,cb_ptr);
      if (pvVar3 != (void *)0x0) goto LAB_00137c9e;
      bundle_destroy(cb_ptr);
    }
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  else {
LAB_00137c9e:
    Curl_llist_insert_next(&cb_ptr->conn_list,(cb_ptr->conn_list).tail,conn,&conn->bundle_node);
    conn->bundle = cb_ptr;
    cb_ptr->num_connections = cb_ptr->num_connections + 1;
    sVar1 = connc->num_conn;
    lVar2 = connc->next_connection_id;
    conn->connection_id = lVar2;
    connc->num_conn = sVar1 + 1;
    connc->next_connection_id = lVar2 + 1;
    CVar4 = CURLE_OK;
  }
  if (data->share != (Curl_share *)0x0) {
    Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
  }
  return CVar4;
}

Assistant:

CURLcode Curl_conncache_add_conn(struct conncache *connc,
                                 struct connectdata *conn)
{
  CURLcode result;
  struct connectbundle *bundle;
  struct connectbundle *new_bundle = NULL;
  struct Curl_easy *data = conn->data;

  /* *find_bundle() locks the connection cache */
  bundle = Curl_conncache_find_bundle(conn, data->state.conn_cache);
  if(!bundle) {
    int rc;
    char key[128];

    result = bundle_create(data, &new_bundle);
    if(result) {
      goto unlock;
    }

    hashkey(conn, key, sizeof(key));
    rc = conncache_add_bundle(data->state.conn_cache, key, new_bundle);

    if(!rc) {
      bundle_destroy(new_bundle);
      result = CURLE_OUT_OF_MEMORY;
      goto unlock;
    }
    bundle = new_bundle;
  }

  result = bundle_add_conn(bundle, conn);
  if(result) {
    if(new_bundle)
      conncache_remove_bundle(data->state.conn_cache, new_bundle);
    goto unlock;
  }

  conn->connection_id = connc->next_connection_id++;
  connc->num_conn++;

  DEBUGF(infof(conn->data, "Added connection %ld. "
               "The cache now contains %" CURL_FORMAT_CURL_OFF_TU " members\n",
               conn->connection_id, (curl_off_t) connc->num_conn));

  unlock:
  CONN_UNLOCK(data);

  return result;
}